

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O0

cali_variant_t cali_variant_unpack(uchar *buf,size_t *inc,_Bool *okptr)

{
  cali_variant_t cVar1;
  uchar *puVar2;
  uint64_t ts;
  size_t p;
  _Bool *okptr_local;
  size_t *inc_local;
  uchar *buf_local;
  cali_variant_t v;
  
  p = (size_t)okptr;
  okptr_local = (_Bool *)inc;
  inc_local = (size_t *)buf;
  memset(&buf_local,0,0x10);
  ts = 0;
  puVar2 = (uchar *)vldec_u64((uchar *)inc_local,&ts);
  if (((ulong)puVar2 & 0xff) < 10) {
    buf_local = puVar2;
    v.type_and_size = vldec_u64((uchar *)((long)inc_local + ts),&ts);
    if (okptr_local != (_Bool *)0x0) {
      *(uint64_t *)okptr_local = ts + *(long *)okptr_local;
    }
    if (p != 0) {
      *(undefined1 *)p = 1;
    }
  }
  else if (p != 0) {
    *(undefined1 *)p = 0;
  }
  cVar1.value.v_uint = v.type_and_size;
  cVar1.type_and_size = (uint64_t)buf_local;
  return cVar1;
}

Assistant:

cali_variant_t cali_variant_unpack(const unsigned char* buf, size_t* inc, bool* okptr)
{
    cali_variant_t v = { 0, { .v_uint = 0 } };
    size_t         p = 0;

    uint64_t ts = vldec_u64(buf, &p);

    if (_EXTRACT_TYPE(ts) > CALI_MAXTYPE) {
        if (okptr)
            *okptr = false;

        return v;
    }

    v.type_and_size = ts;
    v.value.v_uint  = vldec_u64(buf + p, &p);

    if (inc)
        *inc += p;
    if (okptr)
        *okptr = true;

    return v;
}